

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

void __thiscall
Fl_Text_Editor::remove_key_binding(Fl_Text_Editor *this,int key,int state,Key_Binding **list)

{
  Key_Binding *local_30;
  Key_Binding *last;
  Key_Binding *cur;
  Key_Binding **list_local;
  int state_local;
  int key_local;
  Fl_Text_Editor *this_local;
  
  local_30 = (Key_Binding *)0x0;
  for (last = *list; (last != (Key_Binding *)0x0 && ((last->key != key || (last->state != state))));
      last = last->next) {
    local_30 = last;
  }
  if (last != (Key_Binding *)0x0) {
    if (local_30 == (Key_Binding *)0x0) {
      *list = last->next;
    }
    else {
      local_30->next = last->next;
    }
    if (last != (Key_Binding *)0x0) {
      operator_delete(last,0x18);
    }
  }
  return;
}

Assistant:

void Fl_Text_Editor::remove_key_binding(int key, int state, Key_Binding** list) {
  Key_Binding *cur, *last = 0;
  for (cur = *list; cur; last = cur, cur = cur->next)
    if (cur->key == key && cur->state == state) break;
  if (!cur) return;
  if (last) last->next = cur->next;
  else *list = cur->next;
  delete cur;
}